

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O1

uint Abc_NtkDelayTraceTCEdges(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,float tDelta,int fUseLutLib)

{
  float fVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_118 [32];
  float local_98 [32];
  
  if (fUseLutLib == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = Abc_FrameReadLibLut();
  }
  pAVar3 = pNode->pNtk;
  fVar1 = pAVar3->pLutTimes[(long)pNode->Id * 3 + 1];
  if (pvVar6 == (void *)0x0) {
    lVar7 = (long)(pNode->vFanins).nSize;
    if (0 < lVar7) {
      lVar8 = 0;
      uVar5 = 0;
      do {
        plVar4 = (long *)pAVar3->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
        uVar9 = 1 << ((byte)lVar8 & 0x1f);
        if (*(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) + 1.0 + tDelta <=
            fVar1) {
          uVar9 = 0;
        }
        uVar5 = uVar5 | uVar9;
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      return uVar5;
    }
  }
  else if (*(int *)((long)pvVar6 + 0xc) == 0) {
    lVar7 = (long)(pNode->vFanins).nSize;
    if (0 < lVar7) {
      lVar8 = 0;
      uVar5 = 0;
      do {
        plVar4 = (long *)pAVar3->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
        uVar9 = 1 << ((byte)lVar8 & 0x1f);
        if (*(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) +
            *(float *)((long)pvVar6 + lVar7 * 0x84 + 0x94) + tDelta <= fVar1) {
          uVar9 = 0;
        }
        uVar5 = uVar5 | uVar9;
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      return uVar5;
    }
  }
  else {
    iVar2 = (pNode->vFanins).nSize;
    Abc_NtkDelayTraceSortPins(pNode,local_118,local_98);
    lVar7 = (long)(pNode->vFanins).nSize;
    if (0 < lVar7) {
      lVar8 = 0;
      uVar5 = 0;
      do {
        plVar4 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[local_118[lVar8]]];
        uVar9 = 1 << ((byte)local_118[lVar8] & 0x1f);
        if (*(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) +
            *(float *)((long)pvVar6 + lVar8 * 4 + (long)iVar2 * 0x84 + 0x94) + tDelta <= fVar1) {
          uVar9 = 0;
        }
        uVar5 = uVar5 | uVar9;
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
      return uVar5;
    }
  }
  return 0;
}

Assistant:

unsigned Abc_NtkDelayTraceTCEdges( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, float tDelta, int fUseLutLib )
{
    int pPinPerm[32];
    float pPinDelays[32];
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pFanin;
    unsigned uResult = 0;
    float tRequired, * pDelays;
    int k;
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    tRequired = Abc_ObjRequired(pNode);
    if ( pLutLib == NULL )
    {
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( tRequired < Abc_ObjArrival(pFanin) + 1.0 + tDelta )
                uResult |= (1 << k);
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( tRequired < Abc_ObjArrival(pFanin) + pDelays[0] + tDelta )
                uResult |= (1 << k);
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
        Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( tRequired < Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k] + tDelta )
                uResult |= (1 << pPinPerm[k]);
    }
    return uResult;
}